

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

bool __thiscall
pybind11::detail::
optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::load(optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,handle src,bool convert)

{
  size_type *psVar1;
  bool bVar2;
  undefined1 local_40 [8];
  value_conv inner_caster;
  
  if (src.m_ptr == (PyObject *)0x0) {
    bVar2 = false;
  }
  else if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    bVar2 = true;
  }
  else {
    psVar1 = &inner_caster.
              super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .value._M_string_length;
    inner_caster.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value._M_dataplus._M_p = (pointer)0x0;
    inner_caster.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value._M_string_length._0_1_ = 0;
    local_40 = (undefined1  [8])psVar1;
    bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_40,src,convert);
    if (bVar2) {
      std::optional<std::__cxx11::string>::emplace<std::__cxx11::string>
                ((optional<std::__cxx11::string> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    if (local_40 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_40,
                      CONCAT71(inner_caster.
                               super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               .value._M_string_length._1_7_,
                               (undefined1)
                               inner_caster.
                               super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               .value._M_string_length) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!src) {
            return false;
        }
        if (src.is_none()) {
            return true;  // default-constructed value is already empty
        }
        value_conv inner_caster;
        if (!inner_caster.load(src, convert))
            return false;

        value.emplace(cast_op<typename T::value_type &&>(std::move(inner_caster)));
        return true;
    }